

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O2

bool __thiscall
cmm::CMMParser::parseBinOpRHS
          (CMMParser *this,int8_t ExprPrec,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  ExpressionAST *pEVar1;
  undefined1 auVar2 [8];
  _Alloc_hider _Var3;
  bool bVar4;
  int8_t iVar5;
  bool bVar6;
  int8_t iVar7;
  InfixOpExprAST *this_00;
  undefined7 in_register_00000031;
  TokenKind TokenKind;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_a0;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_98;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_90;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_88;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_80;
  undefined1 local_78 [8];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_70;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_68;
  undefined4 local_5c;
  string *local_58;
  string Symbol;
  
  local_5c = (undefined4)CONCAT71(in_register_00000031,ExprPrec);
  local_a0._M_head_impl = (ExpressionAST *)0x0;
  TokenKind = (this->Lexer).CurTok.Kind;
  if (TokenKind == Equal) {
    CMMLexer::Lex(&this->Lexer);
    bVar4 = parseExpression(this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                  *)&local_a0);
    bVar6 = true;
    if (bVar4) goto LAB_00108a56;
    local_68._M_head_impl =
         (Res->_M_t).
         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
         super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    local_70._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl = (ExpressionAST *)0x0;
    BinaryOperatorAST::create
              ((BinaryOperatorAST *)&Symbol,Equal,
               (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_68
               ,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                &local_70);
    _Var3 = Symbol._M_dataplus;
    Symbol._M_dataplus._M_p = (pointer)0x0;
    pEVar1 = (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)_Var3._M_p;
    if (pEVar1 != (ExpressionAST *)0x0) {
      (*(pEVar1->super_AST)._vptr_AST[1])();
      if (Symbol._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)Symbol._M_dataplus._M_p + 8))();
      }
    }
    Symbol._M_dataplus._M_p = (pointer)0x0;
    if (local_70._M_head_impl != (ExpressionAST *)0x0) {
      (*((local_70._M_head_impl)->super_AST)._vptr_AST[1])();
    }
    local_70._M_head_impl = (ExpressionAST *)0x0;
    if (local_68._M_head_impl != (ExpressionAST *)0x0) {
      (*((local_68._M_head_impl)->super_AST)._vptr_AST[1])();
    }
    local_68._M_head_impl = (ExpressionAST *)0x0;
  }
  else {
    local_58 = (string *)&(this->Lexer).StrVal;
    while( true ) {
      iVar5 = getBinOpPrecedence(this);
      if (iVar5 < (char)local_5c) break;
      std::__cxx11::string::string((string *)&Symbol,local_58);
      CMMLexer::Lex(&this->Lexer);
      bVar6 = parsePrimaryExpression
                        (this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                               *)&local_a0);
      if (bVar6) {
LAB_00108a49:
        std::__cxx11::string::~string((string *)&Symbol);
        bVar6 = true;
        goto LAB_00108a56;
      }
      iVar7 = getBinOpPrecedence(this);
      if (iVar5 < iVar7) {
        bVar6 = parseBinOpRHS(this,iVar5 + '\x01',
                              (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                               *)&local_a0);
        if (bVar6) goto LAB_00108a49;
      }
      if (TokenKind == InfixOp) {
        this_00 = (InfixOpExprAST *)operator_new(0x40);
        local_80._M_head_impl =
             (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
        local_88._M_head_impl = local_a0._M_head_impl;
        local_a0._M_head_impl = (ExpressionAST *)0x0;
        InfixOpExprAST::InfixOpExprAST
                  (this_00,&Symbol,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_80,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_88);
        pEVar1 = (Res->_M_t).
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)this_00;
        if (pEVar1 != (ExpressionAST *)0x0) {
          (*(pEVar1->super_AST)._vptr_AST[1])();
        }
        if (local_88._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_88._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_88._M_head_impl = (ExpressionAST *)0x0;
        if (local_80._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_80._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_80._M_head_impl = (ExpressionAST *)0x0;
      }
      else {
        local_90._M_head_impl =
             (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
        local_98._M_head_impl = local_a0._M_head_impl;
        local_a0._M_head_impl = (ExpressionAST *)0x0;
        BinaryOperatorAST::tryFoldBinOp
                  ((BinaryOperatorAST *)local_78,TokenKind,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_90,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_98);
        auVar2 = local_78;
        local_78 = (undefined1  [8])0x0;
        pEVar1 = (Res->_M_t).
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)auVar2;
        if (pEVar1 != (ExpressionAST *)0x0) {
          (*(pEVar1->super_AST)._vptr_AST[1])();
          if (local_78 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_78 + 8))();
          }
        }
        local_78 = (undefined1  [8])0x0;
        if (local_98._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_98._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_98._M_head_impl = (ExpressionAST *)0x0;
        if (local_90._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_90._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_90._M_head_impl = (ExpressionAST *)0x0;
      }
      std::__cxx11::string::~string((string *)&Symbol);
      TokenKind = (this->Lexer).CurTok.Kind;
    }
  }
  bVar6 = false;
LAB_00108a56:
  if (local_a0._M_head_impl != (ExpressionAST *)0x0) {
    (*((local_a0._M_head_impl)->super_AST)._vptr_AST[1])();
  }
  return bVar6;
}

Assistant:

bool CMMParser::parseBinOpRHS(int8_t ExprPrec,
                              std::unique_ptr<ExpressionAST> &Res) {
  std::unique_ptr<ExpressionAST> RHS;

  // Handle assignment expression first.
  if (Lexer.getTok().is(Token::Equal)) {
    Lex();
    if (parseExpression(RHS))
      return true;
    Res = BinaryOperatorAST::create(Token::Equal,
                                    std::move(Res), std::move(RHS));
    return false;
  }
  for (;;) {
    Token::TokenKind TokenKind = getKind();

    // If this is a binOp, find its precedence.
    int8_t TokPrec = getBinOpPrecedence();
    // If the next token is lower precedence than we are allowed to eat,
    // return successfully with what we ate already.
    if (TokPrec < ExprPrec)
      return false;

    // Save the potential symbol before lex.
    std::string Symbol = Lexer.getStrVal();
    // Eat the binary operator.
    Lex();
    // Eat the next primary expression.
    if (parsePrimaryExpression(RHS))
      return true;

    // If BinOp binds less tightly with RHS than the operator after RHS, let
    // the pending operator take RHS as its LHS.
    int8_t NextPrec = getBinOpPrecedence();
    if (TokPrec < NextPrec && parseBinOpRHS(++TokPrec, RHS))
      return true;

    // Merge LHS and RHS according to operator.
    if (TokenKind == Token::InfixOp)
      Res.reset(new InfixOpExprAST(Symbol, std::move(Res), std::move(RHS)));
    else
      Res = BinaryOperatorAST::tryFoldBinOp(TokenKind, std::move(Res),
                                             std::move(RHS));
  }
}